

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall
QMdiSubWindowPrivate::showButtonsInMenuBar(QMdiSubWindowPrivate *this,QMenuBar *menuBar)

{
  QWidget *this_00;
  Data *pDVar1;
  QWidgetData *pQVar2;
  bool mod;
  ViewMode VVar3;
  QMdiArea *this_01;
  ControlContainer *this_02;
  Data *pDVar4;
  QWidget *this_03;
  QLayout *pQVar5;
  int iVar6;
  QObject *pQVar7;
  long lVar8;
  long in_FS_OFFSET;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  this_01 = QMdiSubWindow::mdiArea((QMdiSubWindow *)this_00);
  if (this_01 != (QMdiArea *)0x0) {
    VVar3 = QMdiArea::viewMode(this_01);
    if (VVar3 == TabbedView) goto LAB_0045628b;
  }
  removeButtonsFromMenuBar(this);
  pDVar1 = (this->controlContainer).wp.d;
  if (((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) ||
     ((this->controlContainer).wp.value == (QObject *)0x0)) {
    this_02 = (ControlContainer *)operator_new(0x70);
    QMdi::ControlContainer::ControlContainer(this_02,(QMdiSubWindow *)this_00);
    pDVar4 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this_02);
    pDVar1 = (this->controlContainer).wp.d;
    (this->controlContainer).wp.d = pDVar4;
    (this->controlContainer).wp.value = (QObject *)this_02;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar1 = *(int *)pDVar1 + -1;
      UNLOCK();
      if (*(int *)pDVar1 == 0) {
        operator_delete(pDVar1);
      }
    }
  }
  this->ignoreWindowTitleChange = true;
  QMdi::ControlContainer::showButtonsInMenuBar
            ((ControlContainer *)(this->controlContainer).wp.value,menuBar);
  this->ignoreWindowTitleChange = false;
  this_03 = QWidget::window(this_00);
  mod = QWidget::isWindowModified(this_00);
  QWidget::setWindowModified(this_03,mod);
  QObject::installEventFilter(&this_03->super_QObject);
  pDVar1 = (this->controlContainer).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar7 = (QObject *)0x0;
  }
  else {
    pQVar7 = (this->controlContainer).wp.value;
  }
  if (((*(long *)(pQVar7 + 0x40) == 0) || (*(int *)(*(long *)(pQVar7 + 0x40) + 4) == 0)) ||
     (*(long *)(pQVar7 + 0x48) == 0)) {
    iVar6 = 0;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      pQVar7 = (QObject *)0x0;
    }
    else {
      pQVar7 = (this->controlContainer).wp.value;
    }
    if (((*(long *)(pQVar7 + 0x50) != 0) && (*(int *)(*(long *)(pQVar7 + 0x50) + 4) != 0)) &&
       (*(long *)(pQVar7 + 0x58) != 0)) {
      lVar8 = 0x58;
      goto LAB_0045621b;
    }
  }
  else {
    lVar8 = 0x48;
LAB_0045621b:
    lVar8 = *(long *)(*(long *)((this->controlContainer).wp.value + lVar8) + 0x20);
    iVar6 = (*(int *)(lVar8 + 0x20) - *(int *)(lVar8 + 0x18)) + 1;
  }
  if ((menuBar != (QMenuBar *)0x0) &&
     (pQVar2 = (menuBar->super_QWidget).data,
     ((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i) + 1 < iVar6)) {
    pQVar5 = QWidget::layout(this_03);
    if (pQVar5 != (QLayout *)0x0) {
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
      QEvent::QEvent((QEvent *)&local_38,LayoutRequest);
      QCoreApplication::sendEvent(&this_03->super_QObject,(QEvent *)&local_38);
      QEvent::~QEvent((QEvent *)&local_38);
    }
  }
LAB_0045628b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::showButtonsInMenuBar(QMenuBar *menuBar)
{
    Q_Q(QMdiSubWindow);
    Q_ASSERT(q->isMaximized() && !drawTitleBarWhenMaximized());

    if (isChildOfTabbedQMdiArea(q))
        return;

    removeButtonsFromMenuBar();
    if (!controlContainer)
        controlContainer = new ControlContainer(q);

    ignoreWindowTitleChange = true;
    controlContainer->showButtonsInMenuBar(menuBar);
    ignoreWindowTitleChange = false;

    QWidget *topLevelWindow = q->window();
    topLevelWindow->setWindowModified(q->isWindowModified());
    topLevelWindow->installEventFilter(q);

    int buttonHeight = 0;
    if (controlContainer->controllerWidget())
        buttonHeight = controlContainer->controllerWidget()->height();
    else if (controlContainer->systemMenuLabel())
        buttonHeight = controlContainer->systemMenuLabel()->height();

    // This will rarely happen.
    if (menuBar && menuBar->height() < buttonHeight
            && topLevelWindow->layout()) {
        // Make sure topLevelWindow->contentsRect returns correct geometry.
        // topLevelWidget->updateGeoemtry will not do the trick here since it will post the event.
        QEvent event(QEvent::LayoutRequest);
        QCoreApplication::sendEvent(topLevelWindow, &event);
    }
}